

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20250127::Cord::RemoveSuffix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  char *buffer;
  char *buffer_00;
  uint uVar2;
  byte bVar3;
  uint8_t uVar4;
  CordzInfo *this_00;
  CordRepBtree *pCVar5;
  Nonnull<char_*> pcVar6;
  CordzInfo *extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar7;
  CordRep *pCVar8;
  size_t sVar9;
  AlphaNum *in_R9;
  CordRepBtree *pCVar10;
  CordRepBtree *tree;
  string death_message;
  CordzUpdateScope scope;
  string local_130;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  AlphaNum local_f0;
  CordRepBtree *local_c0;
  char *local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  if (((long)(char)bVar3 & 1U) == 0) {
    uVar7 = (ulong)(long)(char)bVar3 >> 1;
  }
  else {
    uVar7 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar7 < n) {
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Check n <= size() failed: ","");
    local_c0 = (CordRepBtree *)0x16;
    local_b8 = "Requested suffix size ";
    buffer = local_f0.digits_;
    pcVar6 = numbers_internal::FastIntToBuffer(n,buffer);
    local_f0.piece_._M_len = (size_t)(pcVar6 + -(long)buffer);
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    uVar7 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar7 & 1) == 0) {
      sVar9 = uVar7 >> 1;
    }
    else {
      sVar9 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    buffer_00 = local_60.digits_;
    local_f0.piece_._M_str = buffer;
    pcVar6 = numbers_internal::FastIntToBuffer(sVar9,buffer_00);
    local_60.piece_._M_len = (long)pcVar6 - (long)buffer_00;
    local_60.piece_._M_str = buffer_00;
    StrCat_abi_cxx11_(&local_130,(lts_20250127 *)&local_c0,&local_f0,&local_90,&local_60,in_R9);
    std::__cxx11::string::_M_append((char *)local_110,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
               ,0x2c5,local_110);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  pCVar8 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar8 != (CordRep *)0x0 && (bVar3 & 1) != 0) && (pCVar8->length == 0)) {
    RemoveSuffix();
  }
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  pCVar5 = (CordRepBtree *)(this->contents_).data_.rep_.field_0.as_tree.rep;
  if (pCVar5 == (CordRepBtree *)0x0 || ((long)(char)bVar3 & 1U) == 0) {
    if ((bVar3 & 1) != 0) {
      RemoveSuffix();
      this_00 = extraout_RAX;
LAB_0032b91b:
      cord_internal::CordzInfo::Lock(this_00,kRemoveSuffix);
      goto LAB_0032b706;
    }
    if (0x1f < bVar3) {
      __assert_fail("tag <= kMaxInline",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0xb9,"void absl::Cord::InlineRep::reduce_size(size_t)");
    }
    uVar7 = (ulong)(long)(char)bVar3 >> 1;
    tree = (CordRepBtree *)(uVar7 - n);
    if (uVar7 < n) {
      __assert_fail("tag >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0xba,"void absl::Cord::InlineRep::reduce_size(size_t)");
    }
    memset((void *)((long)this + (long)tree + 1),0,n);
    if (tree < (CordRepBtree *)0x10) {
      (this->contents_).data_.rep_.field_0.data[0] = (char)tree * '\x02';
      return;
    }
    RemoveSuffix();
LAB_0032b979:
    cord_internal::CordRep::Destroy(&tree->super_CordRep);
  }
  else {
    this_00 = cord_internal::InlineData::cordz_info((InlineData *)this);
    local_f0.piece_._M_len = (size_t)this_00;
    if (this_00 != (CordzInfo *)0x0) goto LAB_0032b91b;
LAB_0032b706:
    tree = pCVar5;
    if (((pCVar5->super_CordRep).tag == '\x02') &&
       (RemoveSuffix(), tree = local_c0, (extraout_RAX_00 & 1) == 0)) {
      LOCK();
      pRVar1 = &(local_c0->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      cord_internal::CordRep::Unref((CordRep *)pCVar5);
    }
    if (n < (tree->super_CordRep).length) {
      uVar4 = (tree->super_CordRep).tag;
      pCVar5 = tree;
      if (uVar4 != '\x05') {
        if (uVar4 == '\x03') {
          pCVar5 = (CordRepBtree *)cord_internal::CordRepBtree::RemoveSuffix(tree,n);
          goto LAB_0032b83d;
        }
        if ((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
          bVar3 = (tree->super_CordRep).tag;
          if (bVar3 != 1 && bVar3 < 6) {
            __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                          ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
          }
          (tree->super_CordRep).length = (tree->super_CordRep).length - n;
          goto LAB_0032b83d;
        }
      }
      uVar7 = (tree->super_CordRep).length;
      if (uVar7 - n == 0) {
        __assert_fail("n != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a4,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (uVar7 == 0) {
        __assert_fail("pos < rep->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a5,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (uVar7 < n) {
        __assert_fail("n <= rep->length - pos",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a6,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (n == 0) {
        LOCK();
        pRVar1 = &(tree->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
      }
      else {
        if ((tree->super_CordRep).tag == '\x01') {
          pCVar8 = tree->edges_[0];
          pCVar10 = (CordRepBtree *)tree->edges_[1];
        }
        else {
          pCVar8 = (CordRep *)0x0;
          pCVar10 = tree;
        }
        pCVar5 = (CordRepBtree *)operator_new(0x20);
        (pCVar5->super_CordRep).length = 0;
        (pCVar5->super_CordRep).refcount = (atomic<int>)0x0;
        (pCVar5->super_CordRep).tag = '\0';
        (pCVar5->super_CordRep).storage[0] = '\0';
        (pCVar5->super_CordRep).storage[1] = '\0';
        (pCVar5->super_CordRep).storage[2] = '\0';
        pCVar5->edges_[0] = (CordRep *)0x0;
        pCVar5->edges_[1] = (CordRep *)0x0;
        (pCVar5->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        (pCVar5->super_CordRep).length = uVar7 - n;
        (pCVar5->super_CordRep).tag = '\x01';
        pCVar5->edges_[0] = pCVar8;
        if (pCVar10 == (CordRepBtree *)0x0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        pRVar1 = &(pCVar10->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        pCVar5->edges_[1] = &pCVar10->super_CordRep;
      }
      LOCK();
      pRVar1 = &(tree->super_CordRep).refcount;
      uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
LAB_0032baa5:
        __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0xac,
                      "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
      }
      if (uVar2 == 2) {
        cord_internal::CordRep::Destroy(&tree->super_CordRep);
      }
      goto LAB_0032b83d;
    }
    LOCK();
    pRVar1 = &(tree->super_CordRep).refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) goto LAB_0032baa5;
    if (uVar2 == 2) goto LAB_0032b979;
  }
  pCVar5 = (CordRepBtree *)0x0;
LAB_0032b83d:
  sVar9 = local_f0.piece_._M_len;
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
    if (pCVar5 == (CordRepBtree *)0x0) {
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    }
    else {
      (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar5->super_CordRep;
    }
    if ((CordzInfo *)local_f0.piece_._M_len != (CordzInfo *)0x0) {
      Mutex::AssertHeld((Mutex *)(local_f0.piece_._M_len + 0x38));
      *(CordRepBtree **)(sVar9 + 0x40) = pCVar5;
    }
    cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&local_f0);
    return;
  }
  __assert_fail("data_.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                ,0x4fe,
                "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
               );
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}